

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_framing.c
# Opt level: O0

amqp_boolean_t amqp_constant_is_hard_error(int constantNumber)

{
  int constantNumber_local;
  undefined4 local_4;
  
  if (constantNumber == 0x140) {
    local_4 = 1;
  }
  else if (constantNumber == 0x192) {
    local_4 = 1;
  }
  else if (constantNumber == 0x1f5) {
    local_4 = 1;
  }
  else if (constantNumber == 0x1f6) {
    local_4 = 1;
  }
  else if (constantNumber == 0x1f7) {
    local_4 = 1;
  }
  else if (constantNumber == 0x1f8) {
    local_4 = 1;
  }
  else if (constantNumber == 0x1f9) {
    local_4 = 1;
  }
  else if (constantNumber == 0x1fa) {
    local_4 = 1;
  }
  else if (constantNumber == 0x212) {
    local_4 = 1;
  }
  else if (constantNumber == 0x21c) {
    local_4 = 1;
  }
  else if (constantNumber == 0x21d) {
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

amqp_boolean_t amqp_constant_is_hard_error(int constantNumber) {
  switch (constantNumber) {
    case AMQP_CONNECTION_FORCED:
      return 1;
    case AMQP_INVALID_PATH:
      return 1;
    case AMQP_FRAME_ERROR:
      return 1;
    case AMQP_SYNTAX_ERROR:
      return 1;
    case AMQP_COMMAND_INVALID:
      return 1;
    case AMQP_CHANNEL_ERROR:
      return 1;
    case AMQP_UNEXPECTED_FRAME:
      return 1;
    case AMQP_RESOURCE_ERROR:
      return 1;
    case AMQP_NOT_ALLOWED:
      return 1;
    case AMQP_NOT_IMPLEMENTED:
      return 1;
    case AMQP_INTERNAL_ERROR:
      return 1;
    default:
      return 0;
  }
}